

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

aiVector3D __thiscall Assimp::XGLImporter::ReadVec3(XGLImporter *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *c;
  byte *pbVar4;
  ulong uVar5;
  float *pfVar6;
  aiVector3D aVar7;
  float local_40;
  float local_3c;
  undefined8 local_38;
  
  local_38 = 0;
  local_40 = 0.0;
  bVar2 = SkipToText(this);
  if (bVar2) {
    iVar3 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    c = (byte *)CONCAT44(extraout_var,iVar3);
    iVar3 = 0;
LAB_005cb8a2:
    do {
      uVar5 = (ulong)*c;
      if (uVar5 < 0x21) {
        if ((0x100000200U >> (uVar5 & 0x3f) & 1) != 0) {
          c = c + 1;
          goto LAB_005cb8a2;
        }
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_005cb929;
      }
      local_3c = 0.0;
      pbVar4 = (byte *)fast_atoreal_move<float>((char *)c,&local_3c,true);
      pfVar6 = &local_40;
      if ((iVar3 != 2) && (pfVar6 = (float *)&local_38, iVar3 == 1)) {
        pfVar6 = (float *)((long)&local_38 + 4);
      }
      *pfVar6 = local_3c;
      do {
        do {
          c = pbVar4 + 1;
          bVar1 = *pbVar4;
          pbVar4 = c;
        } while (bVar1 == 0x20);
      } while (bVar1 == 9);
      if ((iVar3 != 2) && (bVar1 != 0x2c)) goto LAB_005cb929;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
  }
  else {
LAB_005cb929:
    LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5cb92e);
  }
  aVar7.z = local_40;
  aVar7.x = (float)(undefined4)local_38;
  aVar7.y = (float)local_38._4_4_;
  return aVar7;
}

Assistant:

aiVector3D XGLImporter::ReadVec3()
{
    aiVector3D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec3 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    for(int i = 0; i < 3; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec3");
            return vec;
        }
        vec[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 2 && *s != ',') {
            LogError("expected comma, failed to parse vec3");
            return vec;
        }
        ++s;
    }

    return vec;
}